

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrayproperty.cpp
# Opt level: O2

void __thiscall camp::ArrayProperty::resize(ArrayProperty *this,UserObject *object,size_t newSize)

{
  bool bVar1;
  ForbiddenWrite *pFVar2;
  string *psVar3;
  allocator local_f2;
  allocator local_f1;
  string local_f0;
  string local_d0;
  ForbiddenWrite local_b0;
  ForbiddenWrite local_68;
  
  if (this->m_dynamic == false) {
    pFVar2 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
    psVar3 = Property::name_abi_cxx11_(&this->super_Property);
    ForbiddenWrite::ForbiddenWrite(&local_68,psVar3);
    std::__cxx11::string::string
              ((string *)&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
               ,&local_f1);
    std::__cxx11::string::string
              ((string *)&local_f0,
               "void camp::ArrayProperty::resize(const UserObject &, std::size_t) const",&local_f2);
    Error::prepare<camp::ForbiddenWrite>(pFVar2,&local_68,&local_d0,0x4e,&local_f0);
    __cxa_throw(pFVar2,&ForbiddenWrite::typeinfo,Error::~Error);
  }
  bVar1 = Property::writable(&this->super_Property,object);
  if (bVar1) {
    (*(this->super_Property).super_TagHolder._vptr_TagHolder[8])(this,object,newSize);
    return;
  }
  pFVar2 = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
  psVar3 = Property::name_abi_cxx11_(&this->super_Property);
  ForbiddenWrite::ForbiddenWrite(&local_b0,psVar3);
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/arrayproperty.cpp"
             ,&local_f1);
  std::__cxx11::string::string
            ((string *)&local_f0,
             "void camp::ArrayProperty::resize(const UserObject &, std::size_t) const",&local_f2);
  Error::prepare<camp::ForbiddenWrite>(pFVar2,&local_b0,&local_d0,0x52,&local_f0);
  __cxa_throw(pFVar2,&ForbiddenWrite::typeinfo,Error::~Error);
}

Assistant:

void ArrayProperty::resize(const UserObject& object, std::size_t newSize) const
{
    // Check if the array is dynamic
    if (!dynamic())
        CAMP_ERROR(ForbiddenWrite(name()));

    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    setSize(object, newSize);
}